

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

void __thiscall
slang::analysis::DataFlowAnalysis::joinState
          (DataFlowAnalysis *this,DataFlowState *result,DataFlowState *other)

{
  unsigned_long *puVar1;
  pointer pIVar2;
  uint32_t uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 local_d8 [56];
  uint32_t local_a0;
  uint32_t local_9c;
  bool local_40;
  
  if (result->reachable == other->reachable) {
    uVar4 = (other->assigned).
            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
    if (uVar4 < (result->assigned).
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len) {
      SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
      resizeImpl<slang::SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::ValueInitTag>
                ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)result,
                 uVar4,(ValueInitTag *)local_d8);
    }
    if ((result->assigned).
        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        IntervalMap<unsigned_long,_std::monostate,_3U>::intersection
                  ((IntervalMap<unsigned_long,_std::monostate,_3U> *)local_d8,
                   (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                   ((long)&((result->assigned).
                            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                           .data_)->field_0 + lVar5),
                   (IntervalMap<unsigned_long,_std::monostate,_3U> *)
                   ((long)&((other->assigned).
                            super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                           .data_)->field_0 + lVar5),&this->bitMapAllocator);
        uVar3 = local_9c;
        pIVar2 = (result->assigned).
                 super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_
        ;
        puVar1 = (unsigned_long *)((long)&pIVar2->field_0 + lVar5);
        *(uint32_t *)((long)&pIVar2->height + lVar5) = local_a0;
        local_9c = 0;
        *(uint32_t *)((long)&pIVar2->rootSize + lVar5) = uVar3;
        if (local_a0 == 0) {
          puVar1[6] = CONCAT44(local_d8._52_4_,local_d8._48_4_);
          puVar1[4] = local_d8._32_8_;
          puVar1[5] = CONCAT44(local_d8._44_4_,local_d8._40_4_);
          puVar1[2] = local_d8._16_8_;
          puVar1[3] = local_d8._24_8_;
          *puVar1 = local_d8._0_8_;
          puVar1[1] = local_d8._8_8_;
        }
        else {
          puVar1[4] = local_d8._32_8_;
          puVar1[5] = CONCAT44(local_d8._44_4_,local_d8._40_4_);
          puVar1[2] = local_d8._16_8_;
          puVar1[3] = local_d8._24_8_;
          *puVar1 = local_d8._0_8_;
          puVar1[1] = local_d8._8_8_;
          local_d8._0_8_ = (pointer)0x0;
          local_d8._8_8_ = 0;
          local_d8._16_8_ = 0;
          local_d8._24_8_ = 0;
          local_d8._32_8_ = 0;
          local_d8[0x28] = '\0';
          local_d8[0x29] = '\0';
          local_d8[0x2a] = '\0';
          local_d8[0x2b] = '\0';
          local_d8[0x2c] = '\0';
          local_d8[0x2d] = '\0';
          local_d8[0x2e] = '\0';
          local_d8[0x2f] = '\0';
          local_d8[0x30] = '\0';
          local_d8[0x31] = '\0';
          local_d8[0x32] = '\0';
          local_d8[0x33] = '\0';
          local_d8[0x34] = '\0';
          local_d8[0x35] = '\0';
          local_d8[0x36] = '\0';
          local_d8[0x37] = '\0';
          local_a0 = 0;
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < (result->assigned).
                       super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                       .len);
    }
  }
  else if (result->reachable == false) {
    copyState((DataFlowState *)local_d8,this,other);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::operator=
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)result,
               (SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)local_d8);
    result->reachable = local_40;
    if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x18)) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  return;
}

Assistant:

void DataFlowAnalysis::joinState(DataFlowState& result, const DataFlowState& other) {
    if (result.reachable == other.reachable) {
        if (result.assigned.size() > other.assigned.size())
            result.assigned.resize(other.assigned.size());

        for (size_t i = 0; i < result.assigned.size(); i++) {
            result.assigned[i] = result.assigned[i].intersection(other.assigned[i],
                                                                 bitMapAllocator);
        }
    }
    else if (!result.reachable) {
        result = copyState(other);
    }
}